

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Hes_Emu::start_track_(Hes_Emu *this,int track)

{
  Hes_Cpu *this_00;
  blargg_err_t pcVar1;
  uint i;
  long lVar2;
  
  pcVar1 = Classic_Emu::start_track_(&this->super_Classic_Emu,track);
  if (pcVar1 == (blargg_err_t)0x0) {
    this_00 = &this->super_Hes_Cpu;
    lVar2 = 0;
    memset(this_00,0,0x2000);
    memset(this->sgx,0,0x6008);
    Hes_Apu::reset(&this->apu);
    Hes_Cpu::reset(this_00);
    do {
      Hes_Cpu::set_mmr(this_00,(int)lVar2,(uint)(this->header_).banks[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    Hes_Cpu::set_mmr(this_00,8,0xff);
    (this->irq).disables = '\x06';
    (this->irq).timer = 0x40000000;
    (this->irq).vdp = 0x40000000;
    pcVar1 = (blargg_err_t)0x0;
    (this->timer).enabled = '\0';
    (this->timer).fired = '\0';
    (this->timer).raw_load = 0x80;
    (this->timer).count = (this->timer).load;
    (this->timer).last_time = 0;
    (this->vdp).latch = '\0';
    (this->vdp).control = '\0';
    (this->vdp).next_vbl = 0;
    (this->super_Hes_Cpu).ram[0x1fe] = 0xfe;
    (this->super_Hes_Cpu).ram[0x1ff] = '\x1f';
    (this->super_Hes_Cpu).r.sp = 0xfd;
    (this->super_Hes_Cpu).r.pc = *(uint16_t *)(this->header_).init_addr;
    (this->super_Hes_Cpu).r.a = (uint8_t)track;
    (this->timer).load = this->timer_base * 0x80 + 1;
    this->last_frame_hook = 0;
  }
  return pcVar1;
}

Assistant:

blargg_err_t Hes_Emu::start_track_( int track )
{
	RETURN_ERR( Classic_Emu::start_track_( track ) );
	
	memset( ram, 0, sizeof ram ); // some HES music relies on zero fill
	memset( sgx, 0, sizeof sgx );
	
	apu.reset();
	cpu::reset();
	
	for ( unsigned i = 0; i < sizeof header_.banks; i++ )
		set_mmr( i, header_.banks [i] );
	set_mmr( page_count, 0xFF ); // unmapped beyond end of address space
	
	irq.disables  = timer_mask | vdp_mask;
	irq.timer     = future_hes_time;
	irq.vdp       = future_hes_time;
	
	timer.enabled = false;
	timer.raw_load= 0x80;
	timer.count   = timer.load;
	timer.fired   = false;
	timer.last_time = 0;
	
	vdp.latch     = 0;
	vdp.control   = 0;
	vdp.next_vbl  = 0;
	
	ram [0x1FF] = (idle_addr - 1) >> 8;
	ram [0x1FE] = (idle_addr - 1) & 0xFF;
	r.sp = 0xFD;
	r.pc = get_le16( header_.init_addr );
	r.a  = track;
	
	recalc_timer_load();
	last_frame_hook = 0;
	
	return 0;
}